

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O3

int GetConfRPLIDAR(RPLIDAR *pRPLIDAR,int type,uchar *payload,int payloadsize,uchar *resppayload,
                  int resppayloadsize)

{
  uchar *readbuf;
  int i;
  int iVar1;
  int iVar2;
  long lVar3;
  ssize_t sVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  char *__s;
  uint uVar8;
  int DataType;
  int DataResponseLength;
  int SendMode;
  uchar reqbuf [136];
  int local_cc;
  int local_c8 [2];
  uchar *local_c0;
  byte local_b8 [3];
  int local_b5;
  byte local_b1 [129];
  
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_cc = 0;
  if ((uint)payloadsize < 0x81) {
    local_c0 = resppayload;
    memset(local_b8,0,0x88);
    local_b8[0] = 0xa5;
    local_b8[1] = 0x84;
    local_b8[2] = (char)payloadsize + '\x04';
    local_b5 = type;
    uVar7 = (ulong)(uint)payloadsize;
    if (payloadsize != 0) {
      memcpy(local_b1,payload,uVar7);
    }
    lVar3 = 0;
    bVar5 = 0;
    do {
      bVar5 = bVar5 ^ local_b8[lVar3];
      lVar3 = lVar3 + 1;
    } while (uVar7 + 7 != lVar3);
    uVar8 = payloadsize + 8;
    local_b1[uVar7] = bVar5;
    iVar2 = (pRPLIDAR->RS232Port).DevType;
    if (iVar2 - 1U < 4) {
      iVar2 = (pRPLIDAR->RS232Port).s;
      uVar7 = 0;
      do {
        sVar4 = send(iVar2,local_b8 + uVar7,(long)(int)(uVar8 - (int)uVar7),0);
        if ((int)sVar4 < 1) goto LAB_0012c809;
        uVar6 = (int)uVar7 + (int)sVar4;
        uVar7 = (ulong)uVar6;
      } while ((int)uVar6 < (int)uVar8);
    }
    else {
      if (iVar2 != 0) {
LAB_0012c809:
        __s = "Error writing data to a RPLIDAR. ";
        goto LAB_0012c810;
      }
      iVar2 = *(int *)&(pRPLIDAR->RS232Port).hDev;
      uVar7 = 0;
      do {
        sVar4 = write(iVar2,local_b8 + uVar7,(ulong)(uVar8 - (int)uVar7));
        if ((int)sVar4 < 1) goto LAB_0012c809;
        uVar6 = (int)uVar7 + (int)sVar4;
        uVar7 = (ulong)uVar6;
      } while (uVar6 < uVar8);
    }
    iVar1 = GetResponseDescriptorRPLIDAR(pRPLIDAR,local_c8,local_c8 + 1,&local_cc);
    readbuf = local_c0;
    iVar2 = local_c8[0];
    if (iVar1 != 0) {
      return 1;
    }
    if (local_cc == 0x20) {
      if (resppayloadsize < local_c8[0]) {
        __s = "Error writing data to a RPLIDAR : Invalid resppayloadsize. ";
      }
      else {
        memset(local_c0,0,(long)local_c8[0]);
        iVar2 = ReadAllRS232Port(&pRPLIDAR->RS232Port,readbuf,iVar2);
        if (iVar2 == 0) {
          return 0;
        }
        __s = "A RPLIDAR is not responding correctly. ";
      }
    }
    else {
      __s = "A RPLIDAR is not responding correctly : Bad response descriptor. ";
    }
  }
  else {
    __s = "Error writing data to a RPLIDAR : Invalid payloadsize. ";
  }
LAB_0012c810:
  puts(__s);
  return 1;
}

Assistant:

inline int GetConfRPLIDAR(RPLIDAR* pRPLIDAR, int type, unsigned char* payload, int payloadsize, unsigned char* resppayload, int resppayloadsize)
{
	unsigned char reqbuf[136];
	int DataResponseLength = 0, SendMode = 0, DataType = 0;

	if ((payloadsize < 0)||(payloadsize > 128))
	{
		printf("Error writing data to a RPLIDAR : Invalid payloadsize. \n");
		return EXIT_FAILURE;
	}

	memset(reqbuf, 0, sizeof(reqbuf));
	reqbuf[0] = START_FLAG1_RPLIDAR;
	reqbuf[1] = GET_LIDAR_CONF_REQUEST_RPLIDAR;
	reqbuf[2] = (unsigned char)(4+payloadsize);
	memcpy(reqbuf+3, (unsigned char*)&type, 4);
	if (payloadsize > 0) memcpy(reqbuf+7, payload, payloadsize);
	reqbuf[7+payloadsize] = ComputeChecksumRPLIDAR(reqbuf, 8+payloadsize);

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, 8+payloadsize) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	// Receive the response descriptor.
	if (GetResponseDescriptorRPLIDAR(pRPLIDAR, &DataResponseLength, &SendMode, &DataType) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Quick check of the response descriptor.
	if (DataType != GET_LIDAR_CONF_RESPONSE_RPLIDAR)
	{
		printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
		return EXIT_FAILURE;
	}

	if (DataResponseLength > resppayloadsize)
	{
		printf("Error writing data to a RPLIDAR : Invalid resppayloadsize. \n");
		return EXIT_FAILURE;
	}

	// Receive the data response.
	memset(resppayload, 0, DataResponseLength);
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, resppayload, DataResponseLength) != EXIT_SUCCESS)
	{
		printf("A RPLIDAR is not responding correctly. \n");
		return EXIT_FAILURE;
	}
	return EXIT_SUCCESS;
}